

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_> *
__thiscall CConnman::GetReachableEmptyNetworks(CConnman *this)

{
  bool bVar1;
  ReachableNets *in_RSI;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<Network,_true,_false>,_bool> pVar2;
  int n;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *networks;
  Network net;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  _Node_iterator_base<Network,_false> in_stack_ffffffffffffff78;
  _Optional_payload_base<Network> in_stack_ffffffffffffff88;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *puVar3;
  int local_40;
  optional<bool> local_26;
  int local_24;
  _Node_iterator_base<Network,_false> local_20;
  undefined1 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = in_RDI;
  memset(in_RDI,0,0x38);
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::unordered_set(in_stack_ffffffffffffff68);
  for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
    local_24 = local_40;
    if (((local_40 != 0) && (local_40 != 6)) &&
       (bVar1 = ReachableNets::Contains(in_RSI,(Network)((ulong)puVar3 >> 0x20)), bVar1)) {
      std::optional<Network>::optional<Network_&,_true>
                ((optional<Network> *)in_stack_ffffffffffffff78._M_cur,
                 (Network *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      std::optional<bool>::optional(&local_26);
      in_stack_ffffffffffffff88 =
           (_Optional_payload_base<Network>)
           AddrMan::Size((AddrMan *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                         (optional<Network>)in_stack_ffffffffffffff88,
                         (_Optional_base<bool,_true,_true>)
                         SUB82((ulong)in_stack_ffffffffffffff78._M_cur >> 0x30,0));
      if (in_stack_ffffffffffffff88 == (_Optional_payload_base<Network>)0x0) {
        pVar2 = std::
                unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                ::insert((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                          *)in_stack_ffffffffffffff78._M_cur,
                         (value_type *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
                        );
        in_stack_ffffffffffffff78._M_cur =
             (__node_type *)pVar2.first.super__Node_iterator_base<Network,_false>._M_cur;
        in_stack_ffffffffffffff77 = pVar2.second;
        local_20._M_cur = in_stack_ffffffffffffff78._M_cur;
        local_18 = in_stack_ffffffffffffff77;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::unordered_set<Network> CConnman::GetReachableEmptyNetworks() const
{
    std::unordered_set<Network> networks{};
    for (int n = 0; n < NET_MAX; n++) {
        enum Network net = (enum Network)n;
        if (net == NET_UNROUTABLE || net == NET_INTERNAL) continue;
        if (g_reachable_nets.Contains(net) && addrman.Size(net, std::nullopt) == 0) {
            networks.insert(net);
        }
    }
    return networks;
}